

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Builder * capnp::_::PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
                    (Builder *__return_storage_ptr__,PointerBuilder builder,ListSchema schema)

{
  Which elementType;
  SegmentBuilder *pSVar1;
  CapTableBuilder *pCVar2;
  StructPointerCount SVar3;
  undefined1 uVar4;
  ListElementCount LVar5;
  BitsPerElementN<23> BVar6;
  ElementSize EVar7;
  StructSize elementSize;
  anon_union_8_2_eba6ea51_for_Type_5 aVar8;
  undefined8 uVar9;
  ListBuilder *__return_storage_ptr___00;
  ListSchema schema_local;
  ListBuilder local_78;
  ListBuilder local_50;
  
  aVar8 = schema.elementType.field_4;
  uVar9 = schema.elementType._0_8_;
  schema_local.elementType._0_8_ = uVar9;
  schema_local.elementType.field_4.scopeId = aVar8.scopeId;
  if (schema.elementType.baseType == STRUCT &&
      ((undefined1  [16])schema.elementType & (undefined1  [16])0xff0000) == (undefined1  [16])0x0)
  {
    Type::asStruct(&schema_local.elementType);
    elementSize = anon_unknown_71::structSizeFromSchema
                            ((StructSchema)schema_local.elementType._0_8_);
    __return_storage_ptr___00 = &local_50;
    PointerBuilder::getStructList(__return_storage_ptr___00,&builder,elementSize,(word *)0x0);
  }
  else {
    elementType = LIST;
    if (((undefined1  [16])schema.elementType & (undefined1  [16])0xff0000) == (undefined1  [16])0x0
       ) {
      elementType = schema.elementType.baseType;
    }
    EVar7 = anon_unknown_71::elementSizeFor(elementType);
    __return_storage_ptr___00 = &local_78;
    PointerBuilder::getList(__return_storage_ptr___00,&builder,EVar7,(word *)0x0);
  }
  SVar3 = __return_storage_ptr___00->structPointerCount;
  EVar7 = __return_storage_ptr___00->elementSize;
  uVar4 = __return_storage_ptr___00->field_0x27;
  (__return_storage_ptr__->builder).structDataSize = __return_storage_ptr___00->structDataSize;
  (__return_storage_ptr__->builder).structPointerCount = SVar3;
  (__return_storage_ptr__->builder).elementSize = EVar7;
  (__return_storage_ptr__->builder).field_0x27 = uVar4;
  pSVar1 = __return_storage_ptr___00->segment;
  pCVar2 = __return_storage_ptr___00->capTable;
  LVar5 = __return_storage_ptr___00->elementCount;
  BVar6 = __return_storage_ptr___00->step;
  (__return_storage_ptr__->builder).ptr = __return_storage_ptr___00->ptr;
  (__return_storage_ptr__->builder).elementCount = LVar5;
  (__return_storage_ptr__->builder).step = BVar6;
  (__return_storage_ptr__->builder).segment = pSVar1;
  (__return_storage_ptr__->builder).capTable = pCVar2;
  (__return_storage_ptr__->schema).elementType.baseType = (Which)uVar9;
  (__return_storage_ptr__->schema).elementType.listDepth = SUB81(uVar9,2);
  (__return_storage_ptr__->schema).elementType.isImplicitParam = SUB81(uVar9,3);
  (__return_storage_ptr__->schema).elementType.field_3 = SUB82(uVar9,4);
  *(short *)&(__return_storage_ptr__->schema).elementType.field_0x6 = SUB82(uVar9,6);
  (__return_storage_ptr__->schema).elementType.field_4 = aVar8;
  return __return_storage_ptr__;
}

Assistant:

DynamicList::Builder PointerHelpers<DynamicList, Kind::OTHER>::getDynamic(
    PointerBuilder builder, ListSchema schema) {
  if (schema.whichElementType() == schema::Type::STRUCT) {
    return DynamicList::Builder(schema,
        builder.getStructList(
            structSizeFromSchema(schema.getStructElementType()),
            nullptr));
  } else {
    return DynamicList::Builder(schema,
        builder.getList(elementSizeFor(schema.whichElementType()), nullptr));
  }
}